

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationYY<std::complex<float>_>::matrix(RotationYY<std::complex<float>_> *this)

{
  undefined4 uVar1;
  undefined4 *puVar2;
  data_type extraout_RDX;
  long in_RSI;
  uint uVar3;
  SquareMatrix<std::complex<float>_> SVar4;
  long local_28;
  
  uVar1 = *(undefined4 *)(in_RSI + 0x14);
  uVar3 = *(uint *)(in_RSI + 0x18) ^ 0x80000000;
  local_28 = (ulong)*(uint *)(in_RSI + 0x18) << 0x20;
  (this->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)0x4;
  puVar2 = (undefined4 *)operator_new__(0x80);
  *(undefined4 **)&(this->super_QRotationGate2<std::complex<float>_>).super_QAdjustable = puVar2;
  *puVar2 = uVar1;
  puVar2[1] = 0;
  *(undefined1 (*) [16])(puVar2 + 2) = (undefined1  [16])0x0;
  *(long *)(puVar2 + 6) = local_28;
  *(undefined8 *)(puVar2 + 8) = 0;
  puVar2[10] = uVar1;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0x80000000;
  puVar2[0xd] = uVar3;
  *(undefined1 (*) [16])(puVar2 + 0xe) = (undefined1  [16])0x0;
  puVar2[0x12] = 0x80000000;
  puVar2[0x13] = uVar3;
  puVar2[0x14] = uVar1;
  puVar2[0x15] = 0;
  *(undefined8 *)(puVar2 + 0x16) = 0;
  *(long *)(puVar2 + 0x18) = local_28;
  *(undefined8 *)(puVar2 + 0x1a) = 0;
  *(undefined8 *)(puVar2 + 0x1c) = 0;
  puVar2[0x1e] = uVar1;
  puVar2[0x1f] = 0;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d ,-o , 0 ,
                                                  0 ,-o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }